

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_dr_wav__seek_forward(ma_dr_wav_seek_proc onSeek,ma_uint64 offset,void *pUserData)

{
  ma_bool32 mVar1;
  
  while( true ) {
    while( true ) {
      if (offset == 0) {
        return 1;
      }
      if (offset >> 0x1f != 0) break;
      mVar1 = (*onSeek)(pUserData,(int)offset,ma_dr_wav_seek_origin_current);
      offset = 0;
      if (mVar1 == 0) {
        return 0;
      }
    }
    mVar1 = (*onSeek)(pUserData,0x7fffffff,ma_dr_wav_seek_origin_current);
    if (mVar1 == 0) break;
    offset = offset - 0x7fffffff;
  }
  return 0;
}

Assistant:

MA_PRIVATE ma_bool32 ma_dr_wav__seek_forward(ma_dr_wav_seek_proc onSeek, ma_uint64 offset, void* pUserData)
{
    ma_uint64 bytesRemainingToSeek = offset;
    while (bytesRemainingToSeek > 0) {
        if (bytesRemainingToSeek > 0x7FFFFFFF) {
            if (!onSeek(pUserData, 0x7FFFFFFF, ma_dr_wav_seek_origin_current)) {
                return MA_FALSE;
            }
            bytesRemainingToSeek -= 0x7FFFFFFF;
        } else {
            if (!onSeek(pUserData, (int)bytesRemainingToSeek, ma_dr_wav_seek_origin_current)) {
                return MA_FALSE;
            }
            bytesRemainingToSeek = 0;
        }
    }
    return MA_TRUE;
}